

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O0

void __thiscall kratos::SystemVerilogCodeGen::stmt_code(SystemVerilogCodeGen *this,AssertBase *stmt)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  basic_ostream<char,_std::char_traits<char>_> *pbVar4;
  ostream *poVar5;
  Var *var;
  __shared_ptr *this_00;
  __shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> *this_01;
  element_type *peVar6;
  element_type *stmt_00;
  undefined1 local_78 [8];
  shared_ptr<kratos::AssertPropertyStmt> st_1;
  uint64_t temp;
  string local_50;
  string_view local_30;
  AssertValueStmt *local_20;
  AssertValueStmt *st;
  AssertBase *stmt_local;
  SystemVerilogCodeGen *this_local;
  
  st = (AssertValueStmt *)stmt;
  stmt_local = (AssertBase *)this;
  iVar3 = (*(stmt->super_Stmt).super_IRNode._vptr_IRNode[0xd])();
  if (iVar3 == 0) {
    local_20 = st;
    local_30 = indent(this);
    pbVar4 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)
                             &(this->stream_).super_stringstream.field_0x10,local_30);
    poVar5 = std::operator<<(pbVar4,"assert (");
    var = AssertValueStmt::value(local_20);
    Stream::var_str_abi_cxx11_(&local_50,&this->stream_,var);
    poVar5 = std::operator<<(poVar5,(string *)&local_50);
    std::operator<<(poVar5,")");
    std::__cxx11::string::~string((string *)&local_50);
    this_00 = (__shared_ptr *)AssertValueStmt::else_(local_20);
    bVar1 = std::__shared_ptr::operator_cast_to_bool(this_00);
    if (bVar1) {
      std::operator<<((ostream *)&(this->stream_).super_stringstream.field_0x10," else ");
      st_1.super___shared_ptr<kratos::AssertPropertyStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this->indent_;
      this->indent_ = 0;
      this_01 = &AssertValueStmt::else_(local_20)->
                 super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>;
      peVar6 = std::__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>::get(this_01);
      (**this->_vptr_SystemVerilogCodeGen)(this,peVar6);
      this->indent_ =
           (uint64_t)
           st_1.super___shared_ptr<kratos::AssertPropertyStmt,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
    }
    else {
      poVar5 = std::operator<<((ostream *)&(this->stream_).super_stringstream.field_0x10,";");
      cVar2 = Stream::endl(&this->stream_);
      std::operator<<(poVar5,cVar2);
    }
  }
  else {
    Stmt::as<kratos::AssertPropertyStmt>((Stmt *)local_78);
    stmt_00 = std::__shared_ptr<kratos::AssertPropertyStmt,_(__gnu_cxx::_Lock_policy)2>::get
                        ((__shared_ptr<kratos::AssertPropertyStmt,_(__gnu_cxx::_Lock_policy)2> *)
                         local_78);
    stmt_code(this,stmt_00);
    std::shared_ptr<kratos::AssertPropertyStmt>::~shared_ptr
              ((shared_ptr<kratos::AssertPropertyStmt> *)local_78);
  }
  return;
}

Assistant:

void SystemVerilogCodeGen::stmt_code(AssertBase* stmt) {
    if (stmt->assert_type() == AssertType::AssertValue) {
        auto* st = reinterpret_cast<AssertValueStmt*>(stmt);
        stream_ << indent() << "assert (" << stream_.var_str(st->value()) << ")";
        if (st->else_()) {
            stream_ << " else ";
            // turn off the indent
            auto temp = indent_;
            indent_ = 0;
            dispatch_node(st->else_().get());
            indent_ = temp;
            // dispatch code will close the ;
        } else {
            stream_ << ";" << stream_.endl();
        }
    } else {
        auto st = stmt->as<AssertPropertyStmt>();
        stmt_code(st.get());
    }
}